

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.hh
# Opt level: O2

bool __thiscall PcodeOp::isCollapsible(PcodeOp *this)

{
  pointer ppVVar1;
  pointer ppVVar2;
  long lVar3;
  int4 i;
  long lVar4;
  
  if (((this->opcode->opcode != CPUI_COPY) && ((this->flags & 0x10) == 0)) &&
     (this->output != (Varnode *)0x0)) {
    ppVVar2 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar3 = (long)(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppVVar2;
    if (lVar3 != 0) {
      lVar4 = 0;
      do {
        if (lVar3 >> 3 == lVar4) {
          return (uint)this->output->size < 9;
        }
        ppVVar1 = ppVVar2 + lVar4;
        lVar4 = lVar4 + 1;
      } while (((*ppVVar1)->flags & 2) != 0);
    }
  }
  return false;
}

Assistant:

bool isCommutative(void) const { return ((flags & PcodeOp::commutative)!=0); }